

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

bool cvui::mouse(String *theWindowName,int theButton,int theQuery)

{
  undefined1 uVar1;
  cvui_context_t *pcVar2;
  undefined8 extraout_RAX;
  cvui_mouse_btn_t *pcVar3;
  string local_38;
  
  if (2 < (uint)theButton) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Invalid mouse button. Are you using one of the available: cvui::{RIGHT,MIDDLE,LEFT}_BUTTON ?"
               ,"");
    internal::error(6,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  pcVar2 = internal::getContext(theWindowName);
  uVar1 = 0;
  if (theQuery - 2U < 6) {
    pcVar3 = (pcVar2->mouse).buttons + (uint)theButton;
    uVar1 = 0;
    switch(theQuery) {
    case 2:
      pcVar3 = (cvui_mouse_btn_t *)&(pcVar2->mouse).buttons[(uint)theButton].justPressed;
      break;
    case 4:
    case 5:
      goto switchD_00109e6d_caseD_4;
    case 7:
      pcVar3 = (cvui_mouse_btn_t *)&(pcVar2->mouse).buttons[(uint)theButton].pressed;
    }
    uVar1 = pcVar3->justReleased;
  }
switchD_00109e6d_caseD_4:
  return (bool)uVar1;
}

Assistant:

bool mouse(const cv::String& theWindowName, int theButton, int theQuery) {
	if (theButton != RIGHT_BUTTON && theButton != MIDDLE_BUTTON && theButton != LEFT_BUTTON) {
		internal::error(6, "Invalid mouse button. Are you using one of the available: cvui::{RIGHT,MIDDLE,LEFT}_BUTTON ?");
	}

	cvui_mouse_btn_t& aButton = internal::getContext(theWindowName).mouse.buttons[theButton];
	bool aRet = internal::isMouseButton(aButton, theQuery);

	return aRet;
}